

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O1

bool __thiscall OPLmusicBlock::ServiceStream(OPLmusicBlock *this,void *buff,int numbytes)

{
  ulong *puVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  OPLio *pOVar5;
  bool bVar6;
  int count;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  double dVar12;
  
  bVar11 = ((this->super_musicBlock).io)->IsOPL3 | this->FullPan;
  uVar8 = (ulong)(long)numbytes >> (bVar11 + 2 & 0x3f);
  bVar3 = false;
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->ChipAccess);
  bVar2 = true;
  do {
    iVar7 = (int)uVar8;
    if (iVar7 < 1) break;
    dVar12 = this->NextTickIn;
    uVar4 = (uint)dVar12;
    uVar10 = (ulong)uVar4;
    if (iVar7 < (int)uVar4) {
      uVar10 = uVar8 & 0xffffffff;
    }
    iVar9 = (int)uVar10;
    if (0 < (int)uVar4) {
      pOVar5 = (this->super_musicBlock).io;
      if (pOVar5->NumChips != 0) {
        uVar8 = 0;
        do {
          (*pOVar5->chips[uVar8]->_vptr_OPLEmul[4])(pOVar5->chips[uVar8],buff,uVar10);
          uVar8 = uVar8 + 1;
          pOVar5 = (this->super_musicBlock).io;
        } while (uVar8 < pOVar5->NumChips);
      }
      count = iVar9 << (bVar11 & 0x1f);
      OffsetSamples(this,(float *)buff,count);
      if (dVar12 != this->NextTickIn) {
        __assert_fail("NextTickIn == ticky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                      ,0xf4,"bool OPLmusicBlock::ServiceStream(void *, int)");
      }
      dVar12 = this->NextTickIn - (double)iVar9;
      this->NextTickIn = dVar12;
      if (dVar12 < 0.0) {
        __assert_fail("NextTickIn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                      ,0xf6,"bool OPLmusicBlock::ServiceStream(void *, int)");
      }
      uVar8 = (ulong)(uint)(iVar7 - iVar9);
      buff = (void *)((long)buff + (long)count * 4);
    }
    bVar6 = true;
    if (this->NextTickIn <= 1.0 && this->NextTickIn != 1.0) {
      uVar4 = (*this->_vptr_OPLmusicBlock[3])(this);
      if ((int)uVar4 < 0) {
        __assert_fail("next >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                      ,0xfe,"bool OPLmusicBlock::ServiceStream(void *, int)");
      }
      if (uVar4 == 0) {
        if ((this->Looping != true) || (bVar3)) {
          if (0 < (int)uVar8) {
            pOVar5 = (this->super_musicBlock).io;
            if (pOVar5->NumChips != 0) {
              uVar10 = 0;
              do {
                (*pOVar5->chips[uVar10]->_vptr_OPLEmul[4])
                          (pOVar5->chips[uVar10],buff,uVar8 & 0xffffffff);
                uVar10 = uVar10 + 1;
                pOVar5 = (this->super_musicBlock).io;
              } while (uVar10 < pOVar5->NumChips);
            }
            OffsetSamples(this,(float *)buff,(int)uVar8 << (bVar11 & 0x1f));
          }
          bVar2 = false;
          bVar6 = false;
        }
        else {
          (*this->_vptr_OPLmusicBlock[2])(this);
          bVar3 = true;
          bVar6 = true;
        }
      }
      else {
        pOVar5 = (this->super_musicBlock).io;
        (*pOVar5->_vptr_OPLio[6])(pOVar5,(ulong)uVar4);
        dVar12 = (double)(int)uVar4 * this->SamplesPerTick + this->NextTickIn;
        this->NextTickIn = dVar12;
        if (dVar12 < 0.0) {
          __assert_fail("NextTickIn >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                        ,0x11a,"bool OPLmusicBlock::ServiceStream(void *, int)");
        }
        puVar1 = &(this->super_musicBlock).MLtime;
        *puVar1 = *puVar1 + (ulong)uVar4;
        bVar3 = false;
      }
    }
  } while (bVar6);
  FCriticalSection::Leave(&this->ChipAccess);
  return bVar2;
}

Assistant:

bool OPLmusicBlock::ServiceStream (void *buff, int numbytes)
{
	float *samples1 = (float *)buff;
	int stereoshift = (int)(FullPan | io->IsOPL3);
	int numsamples = numbytes / (sizeof(float) << stereoshift);
	bool prevEnded = false;
	bool res = true;

	memset(buff, 0, numbytes);

	ChipAccess.Enter();
	while (numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);
		size_t i;

		if (samplesleft > 0)
		{
			for (i = 0; i < io->NumChips; ++i)
			{
				io->chips[i]->Update(samples1, samplesleft);
			}
			OffsetSamples(samples1, samplesleft << stereoshift);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert (NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft << stereoshift;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (!Looping || prevEnded)
				{
					if (numsamples > 0)
					{
						for (i = 0; i < io->NumChips; ++i)
						{
							io->chips[i]->Update(samples1, numsamples);
						}
						OffsetSamples(samples1, numsamples << stereoshift);
					}
					res = false;
					break;
				}
				else
				{
					// Avoid infinite loops from songs that do nothing but end
					prevEnded = true;
					Restart ();
				}
			}
			else
			{
				prevEnded = false;
				io->WriteDelay(next);
				NextTickIn += SamplesPerTick * next;
				assert (NextTickIn >= 0);
				MLtime += next;
			}
		}
	}
	ChipAccess.Leave();
	return res;
}